

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_dpb.c
# Opt level: O0

MPP_RET unmark_long_term_field_for_reference_by_frame_idx
                  (H264_DpbBuf_t *p_Dpb,RK_S32 structure,RK_S32 long_term_frame_idx,
                  RK_S32 mark_current,RK_U32 curr_frame_num,RK_S32 curr_pic_num)

{
  H264dVideoCtx_t *p_Vid;
  byte local_2d;
  MPP_RET ret;
  RK_U8 i;
  RK_S32 curr_pic_num_local;
  RK_U32 curr_frame_num_local;
  RK_S32 mark_current_local;
  RK_S32 long_term_frame_idx_local;
  RK_S32 structure_local;
  H264_DpbBuf_t *p_Dpb_local;
  
  if (structure == 3) {
    if ((h264d_debug & 4) != 0) {
      _mpp_log_l(4,"h264d_dpb","value error(%d).\n",(char *)0x0,0x16c);
    }
    p_Dpb_local._4_4_ = MPP_ERR_VALUE;
  }
  else {
    ret = curr_pic_num;
    if (curr_pic_num < 0) {
      ret = p_Dpb->p_Vid->max_frame_num * 2 + curr_pic_num;
    }
    for (local_2d = 0; (uint)local_2d < p_Dpb->ltref_frames_in_buffer; local_2d = local_2d + 1) {
      if (p_Dpb->fs_ltref[local_2d]->long_term_frame_idx == long_term_frame_idx) {
        if (structure == 1) {
          if (p_Dpb->fs_ltref[local_2d]->is_long_term == 3) {
            unmark_for_long_term_reference(p_Dpb->fs_ltref[local_2d]);
          }
          else if (p_Dpb->fs_ltref[local_2d]->is_long_term == 1) {
            unmark_for_long_term_reference(p_Dpb->fs_ltref[local_2d]);
          }
          else if (mark_current == 0) {
            if (p_Dpb->fs_ltref[local_2d]->frame_num != ret >> 1) {
              unmark_for_long_term_reference(p_Dpb->fs_ltref[local_2d]);
            }
          }
          else if (p_Dpb->last_picture == (h264_frame_store_t *)0x0) {
            unmark_for_long_term_reference(p_Dpb->fs_ltref[local_2d]);
          }
          else if ((p_Dpb->last_picture != p_Dpb->fs_ltref[local_2d]) ||
                  (p_Dpb->last_picture->frame_num != curr_frame_num)) {
            unmark_for_long_term_reference(p_Dpb->fs_ltref[local_2d]);
          }
        }
        if (structure == 2) {
          if (p_Dpb->fs_ltref[local_2d]->is_long_term == 3) {
            unmark_for_long_term_reference(p_Dpb->fs_ltref[local_2d]);
          }
          else if (p_Dpb->fs_ltref[local_2d]->is_long_term == 2) {
            unmark_for_long_term_reference(p_Dpb->fs_ltref[local_2d]);
          }
          else if (mark_current == 0) {
            if (p_Dpb->fs_ltref[local_2d]->frame_num != ret >> 1) {
              unmark_for_long_term_reference(p_Dpb->fs_ltref[local_2d]);
            }
          }
          else if (p_Dpb->last_picture == (h264_frame_store_t *)0x0) {
            unmark_for_long_term_reference(p_Dpb->fs_ltref[local_2d]);
          }
          else if ((p_Dpb->last_picture != p_Dpb->fs_ltref[local_2d]) ||
                  (p_Dpb->last_picture->frame_num != curr_frame_num)) {
            unmark_for_long_term_reference(p_Dpb->fs_ltref[local_2d]);
          }
        }
      }
    }
    p_Dpb_local._4_4_ = MPP_OK;
  }
  return p_Dpb_local._4_4_;
}

Assistant:

static MPP_RET unmark_long_term_field_for_reference_by_frame_idx(H264_DpbBuf_t *p_Dpb, RK_S32 structure,
                                                                 RK_S32 long_term_frame_idx, RK_S32 mark_current, RK_U32 curr_frame_num, RK_S32 curr_pic_num)
{
    RK_U8 i = 0;
    MPP_RET ret = MPP_ERR_UNKNOW;
    H264dVideoCtx_t *p_Vid = p_Dpb->p_Vid;

    VAL_CHECK(ret, structure != FRAME);
    if (curr_pic_num < 0)
        curr_pic_num += (2 * p_Vid->max_frame_num);

    for (i = 0; i < p_Dpb->ltref_frames_in_buffer; i++) {
        if (p_Dpb->fs_ltref[i]->long_term_frame_idx == long_term_frame_idx) {
            if (structure == TOP_FIELD) {
                if (p_Dpb->fs_ltref[i]->is_long_term == 3) {
                    unmark_for_long_term_reference(p_Dpb->fs_ltref[i]);
                } else {
                    if (p_Dpb->fs_ltref[i]->is_long_term == 1) {
                        unmark_for_long_term_reference(p_Dpb->fs_ltref[i]);
                    } else {
                        if (mark_current) {
                            if (p_Dpb->last_picture) {
                                if ((p_Dpb->last_picture != p_Dpb->fs_ltref[i]) || p_Dpb->last_picture->frame_num != curr_frame_num)
                                    unmark_for_long_term_reference(p_Dpb->fs_ltref[i]);
                            } else {
                                unmark_for_long_term_reference(p_Dpb->fs_ltref[i]);
                            }
                        } else {
                            if ((p_Dpb->fs_ltref[i]->frame_num) != (unsigned)(curr_pic_num >> 1)) {
                                unmark_for_long_term_reference(p_Dpb->fs_ltref[i]);
                            }
                        }
                    }
                }
            }
            if (structure == BOTTOM_FIELD) {
                if (p_Dpb->fs_ltref[i]->is_long_term == 3) {
                    unmark_for_long_term_reference(p_Dpb->fs_ltref[i]);
                } else {
                    if (p_Dpb->fs_ltref[i]->is_long_term == 2) {
                        unmark_for_long_term_reference(p_Dpb->fs_ltref[i]);
                    } else {
                        if (mark_current) {
                            if (p_Dpb->last_picture) {
                                if ((p_Dpb->last_picture != p_Dpb->fs_ltref[i]) || p_Dpb->last_picture->frame_num != curr_frame_num)
                                    unmark_for_long_term_reference(p_Dpb->fs_ltref[i]);
                            } else {
                                unmark_for_long_term_reference(p_Dpb->fs_ltref[i]);
                            }
                        } else {
                            if ((p_Dpb->fs_ltref[i]->frame_num) != (unsigned)(curr_pic_num >> 1)) {
                                unmark_for_long_term_reference(p_Dpb->fs_ltref[i]);
                            }
                        }
                    }
                }
            }
        }
    }
    return ret = MPP_OK;
__FAILED:
    return ret;
}